

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double chebyshev1_sample(int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  dVar4 = chebyshev1_cdf_inv((double)iVar1 * 4.656612875e-10);
  return dVar4;
}

Assistant:

double chebyshev1_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_SAMPLE samples the Chebyshev1 PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CHEBYSHEV1_SAMPLE, a random sample.
//
{
  double cdf;
  double value;

  cdf = r8_uniform_01 ( seed );

  value = chebyshev1_cdf_inv ( cdf );

  return value;
}